

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

void vkt::tessellation::anon_unknown_0::InvariantOuterEdge::logOuterTessellationLevel
               (TestLog *log,float tessLevel,OuterEdgeDescription *edgeDesc)

{
  ostringstream *this;
  string local_1b0;
  undefined1 local_190 [384];
  
  this = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"Testing with outer tessellation level ",0x26);
  std::ostream::_M_insert<double>((double)tessLevel);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," for the ",9);
  tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
            (&local_1b0,edgeDesc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this," edge, and with various levels for other edges, and with all programs"
             ,0x45);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  return;
}

Assistant:

void logOuterTessellationLevel (tcu::TestLog& log, const float tessLevel, const OuterEdgeDescription& edgeDesc)
{
	log << tcu::TestLog::Message
		<< "Testing with outer tessellation level " << tessLevel << " for the " << edgeDesc.description() << " edge, and with various levels for other edges, and with all programs"
		<< tcu::TestLog::EndMessage;
}